

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::D3MF::XmlSerializer::parseColor(XmlSerializer *this,char *color,aiColor4D *diffuse)

{
  char *__nptr;
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 in_RAX;
  size_t sVar4;
  long lVar5;
  char comp [3];
  undefined8 uStack_28;
  
  if (color != (char *)0x0) {
    uStack_28 = in_RAX;
    sVar4 = strlen(color);
    if (((sVar4 == 9) || (sVar4 == 7)) && (*color == '#')) {
      __nptr = (char *)((long)&uStack_28 + 5);
      uStack_28 = (ulong)CONCAT16(color[2],CONCAT15(color[1],(int5)uStack_28));
      lVar5 = strtol(__nptr,(char **)0x0,0x10);
      uVar1 = uStack_28;
      diffuse->r = (float)lVar5 / 255.0;
      uStack_28._0_6_ = CONCAT15(color[3],(undefined5)uStack_28);
      uStack_28._7_1_ = SUB81(uVar1,7);
      uStack_28._0_7_ = CONCAT16(color[4],(undefined6)uStack_28);
      lVar5 = strtol(__nptr,(char **)0x0,0x10);
      uVar2 = uStack_28;
      diffuse->g = (float)lVar5 / 255.0;
      uStack_28._0_6_ = CONCAT15(color[5],(undefined5)uStack_28);
      uStack_28._7_1_ = SUB81(uVar2,7);
      uStack_28._0_7_ = CONCAT16(color[6],(undefined6)uStack_28);
      lVar5 = strtol(__nptr,(char **)0x0,0x10);
      uVar2 = uStack_28;
      diffuse->b = (float)lVar5 / 255.0;
      if (sVar4 != 7) {
        uStack_28._0_6_ = CONCAT15(color[7],(undefined5)uStack_28);
        uStack_28._7_1_ = SUB81(uVar2,7);
        uStack_28._0_7_ = CONCAT16(color[8],(undefined6)uStack_28);
        lVar5 = strtol((char *)((long)&uStack_28 + 5),(char **)0x0,0x10);
        diffuse->a = (float)lVar5 / 255.0;
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool parseColor( const char *color, aiColor4D &diffuse ) {
        if ( nullptr == color ) {
            return false;
        }

        //format of the color string: #RRGGBBAA or #RRGGBB (3MF Core chapter 5.1.1)
        const size_t len( strlen( color ) );
        if ( 9 != len && 7 != len) {
            return false;
        }

        const char *buf( color );
        if ( '#' != *buf ) {
            return false;
        }
        ++buf;
        char comp[ 3 ] = { 0,0,'\0' };

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.r = static_cast<ai_real>( strtol( comp, NULL, 16 ) ) / ai_real(255.0);


        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.g = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.b = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        if(7 == len)
            return true;
        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.a = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        return true;
    }